

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::LinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                 *con,int i)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  Var VVar2;
  int iVar3;
  ConType *this_00;
  FunctionalConstraint *in_RSI;
  long in_RDI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> ccnew;
  LinTerms lt;
  Var resvar;
  LinearFunctionalConstraint fc;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  AffineExpr *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  LinTerms *in_stack_fffffffffffffb08;
  AlgebraicExpression<mp::LinTerms> *in_stack_fffffffffffffb10;
  int var;
  undefined8 in_stack_fffffffffffffb18;
  undefined1 fSort;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_01;
  LinearFunctionalConstraint *in_stack_fffffffffffffb20;
  Context ctx;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffb28;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *this_02;
  AlgConRhs<0> rr;
  undefined4 in_stack_fffffffffffffb38;
  undefined1 *puVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb68;
  LinTerms *in_stack_fffffffffffffb70;
  Arguments *in_stack_fffffffffffffb98;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
  *in_stack_fffffffffffffba0;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffbf0;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
  *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc4c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffc50;
  undefined1 local_380 [212];
  Var local_2ac;
  _Bit_pointer local_2a8;
  _Bit_type *local_2a0;
  undefined1 local_279 [169];
  Var local_1d0;
  undefined1 local_148 [312];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  local_10._M_allocated_capacity = (size_type)in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  MakeAutoLinker<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
            (in_stack_fffffffffffffb28,
             (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
             in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  fSort = (undefined1)((ulong)in_stack_fffffffffffffb18 >> 0x38);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::GetConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
             0x23154b);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetArguments
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)0x23155c);
  LinTerms::LinTerms(&in_stack_fffffffffffffb10->super_LinTerms,in_stack_fffffffffffffb08);
  puVar4 = local_148;
  AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (double)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  MakeFunctionalConstraint(in_stack_fffffffffffffaf8);
  AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::LinTerms> *)0x2315ac);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                    (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  local_1d0 = VVar2;
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  if (!bVar1) {
    FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
              ((FlatModel<mp::DefaultFlatModelParams> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  }
  local_279._1_8_ = (pointer)0x3ff0000000000000;
  local_279._9_8_ = local_279 + 1;
  local_279._17_8_ = (pointer)0x1;
  rr.rhs_ = (double)local_279;
  std::allocator<double>::allocator((allocator<double> *)0x2316c4);
  __l._M_array._4_4_ = VVar2;
  __l._M_array._0_4_ = in_stack_fffffffffffffb38;
  __l._M_len = (size_type)puVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffffb28);
  local_2ac = local_1d0;
  local_2a8 = (_Bit_pointer)&local_2ac;
  local_2a0 = (_Bit_type *)0x1;
  this_02 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)(local_380 + 0xd3);
  std::allocator<int>::allocator((allocator<int> *)0x231724);
  __l_00._M_array._4_4_ = VVar2;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffb38;
  __l_00._M_len = (size_type)puVar4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,(allocator_type *)this_02);
  LinTerms::LinTerms(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10);
  std::allocator<int>::~allocator((allocator<int> *)0x231781);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10);
  std::allocator<double>::~allocator((allocator<double> *)0x23179b);
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     &in_stack_fffffffffffffaf8->super_LinTerms);
  this_00 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
            GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                           *)0x2317ba);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(this_00);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (this_02,(LinTerms *)this_00,rr,(bool)fSort);
  ctx.value_ = (CtxVal)((ulong)this_00 >> 0x20);
  this_01 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)local_380;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
  ConditionalConstraint(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  var = (int)((ulong)(in_RDI + -0x208) >> 0x20);
  FunctionalConstraint::GetResultVar((FunctionalConstraint *)local_10._M_allocated_capacity);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
  iVar3 = FunctionalConstraint::GetResultVar((FunctionalConstraint *)local_10._M_allocated_capacity)
  ;
  FunctionalConstraint::GetContext((FunctionalConstraint *)local_10._M_allocated_capacity);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr(this_01,var,ctx);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
  ~ConditionalConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
             0x2318a4);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(iVar3,in_stack_fffffffffffffb00));
  LinearFunctionalConstraint::~LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)CONCAT44(iVar3,in_stack_fffffffffffffb00));
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_fffffffffffffbf0);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }